

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abi_test.h
# Opt level: O0

void abi_test::internal::CheckGTest<void,P256_POINT*,P256_POINT_const*,P256_POINT_AFFINE_const*>
               (char *va_args_str,char *file,int line,bool unwind,
               _func_void_P256_POINT_ptr_P256_POINT_ptr_P256_POINT_AFFINE_ptr *func,Type args,
               Type args_1,Type args_2)

{
  bool bVar1;
  Message *pMVar2;
  char *str;
  AssertHelper local_b8;
  Message local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *error;
  iterator __end3;
  iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  Message local_68;
  Message msg;
  crypto_word_t ret;
  Result result;
  Type args_local;
  _func_void_P256_POINT_ptr_P256_POINT_ptr_P256_POINT_AFFINE_ptr *func_local;
  bool unwind_local;
  int line_local;
  char *file_local;
  char *va_args_str_local;
  
  result.errors.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)args;
  Result::Result((Result *)&ret);
  CheckImpl<void,P256_POINT*,P256_POINT_const*,P256_POINT_AFFINE_const*>
            ((Result *)&ret,unwind,func,
             (Type)result.errors.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,args_1,args_2);
  bVar1 = Result::ok((Result *)&ret);
  if (!bVar1) {
    testing::Message::Message(&local_68);
    pMVar2 = testing::Message::operator<<(&local_68,(char (*) [17])"ABI failures in ");
    FixVAArgsString_abi_cxx11_((string *)&__range3,(internal *)va_args_str,str);
    pMVar2 = testing::Message::operator<<
                       (pMVar2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &__range3);
    testing::Message::operator<<(pMVar2,(char (*) [3])0x8b92a1);
    std::__cxx11::string::~string((string *)&__range3);
    __end3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&ret);
    error = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&ret);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end3,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)&error);
      if (!bVar1) break;
      local_a8 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end3);
      pMVar2 = testing::Message::operator<<(&local_68,(char (*) [5])0x89de4a);
      pMVar2 = testing::Message::operator<<(pMVar2,local_a8);
      testing::Message::operator<<(pMVar2,(char (*) [2])0x89ef79);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end3);
    }
    testing::Message::Message(&local_b0);
    pMVar2 = testing::Message::operator<<(&local_b0,&local_68);
    testing::internal::AssertHelper::AssertHelper(&local_b8,kNonFatalFailure,file,line,"Failed");
    testing::internal::AssertHelper::operator=(&local_b8,pMVar2);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    testing::Message::~Message(&local_b0);
    testing::Message::~Message(&local_68);
  }
  Result::~Result((Result *)&ret);
  return;
}

Assistant:

inline R CheckGTest(const char *va_args_str, const char *file, int line,
                    bool unwind, R (*func)(Args...),
                    typename DeductionGuard<Args>::Type... args) {
  Result result;
  crypto_word_t ret = CheckImpl(&result, unwind, func, args...);
  if (!result.ok()) {
    testing::Message msg;
    msg << "ABI failures in " << FixVAArgsString(va_args_str) << ":\n";
    for (const auto &error : result.errors) {
      msg << "    " << error << "\n";
    }
    ADD_FAILURE_AT(file, line) << msg;
  }
  return (R)ret;
}